

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O2

void __thiscall TLeonardoHeap<double>::heapify(TLeonardoHeap<double> *this,size_t root,size_t order)

{
  double dVar1;
  double *pdVar2;
  size_t sVar3;
  size_t sVar4;
  double tmp;
  
  pdVar2 = this->data;
  while( true ) {
    if (order < 2) {
      return;
    }
    sVar4 = (root - 1) - *(long *)("basic_string::_M_construct null not valid" + order * 8 + 0x23);
    sVar3 = root - 1;
    if (pdVar2[root - 1] <= pdVar2[sVar4]) {
      sVar3 = sVar4;
    }
    dVar1 = pdVar2[root];
    if (pdVar2[sVar3] <= dVar1) break;
    if (pdVar2[sVar4] < pdVar2[root - 1]) {
      order = order - 2;
    }
    else {
      order = order - 1;
    }
    pdVar2[root] = pdVar2[sVar3];
    pdVar2[sVar3] = dVar1;
    root = sVar3;
  }
  return;
}

Assistant:

inline void TLeonardoHeap<T>::heapify(size_t root, size_t order) {
	size_t comp, comp_order;
	while(true) {
		if(order <= 1) { break; }	// Break if root is a singleton node
		
		// Determine which of the two children is greater
		if(data[root-1] > data[root-1-Leonardo_k[order-2]]) {
			comp = root-1;
			comp_order = order-2;
		} else {
			comp = root-1-Leonardo_k[order-2];
			comp_order = order-1;
		}
		
		// Compare the root with the greater of the two children
		if(data[comp] > data[root]) { swap(root, comp); } else { break; }
		
		// shift the root downwards
		root = comp;
		order = comp_order;
	}
}